

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool __thiscall
pdqsort_detail::
partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_164db4ee comp)

{
  pdqsort_detail *ppVar1;
  HighsInt u;
  bool bVar2;
  pdqsort_detail *ppVar3;
  long lVar4;
  pdqsort_detail *ppVar5;
  ulong uVar6;
  bool bVar7;
  anon_class_16_2_164db4ee local_50;
  ulong local_40;
  pdqsort_detail *local_38;
  
  local_50.this = (HighsSymmetryDetection *)comp.componentData;
  if (this == (pdqsort_detail *)begin._M_current) {
LAB_002fa749:
    bVar7 = true;
  }
  else {
    uVar6 = 0;
    local_50.componentData = (ComponentData *)end._M_current;
    local_38 = this;
    do {
      lVar4 = -(long)this;
      ppVar3 = this;
      do {
        this = ppVar3 + 4;
        bVar7 = this == (pdqsort_detail *)begin._M_current;
        if (bVar7) goto LAB_002fa749;
        bVar2 = HighsSymmetryDetection::computeComponentData::anon_class_16_2_164db4ee::operator()
                          (&local_50,*(HighsInt *)(ppVar3 + 4),*(HighsInt *)ppVar3);
        lVar4 = lVar4 + -4;
        ppVar3 = this;
      } while (!bVar2);
      u = *(HighsInt *)this;
      local_40 = uVar6;
      do {
        ppVar1 = ppVar3 + -4;
        *(HighsInt *)ppVar3 = *(HighsInt *)(ppVar3 + -4);
        ppVar5 = local_38;
        if (ppVar1 == local_38) break;
        bVar2 = HighsSymmetryDetection::computeComponentData::anon_class_16_2_164db4ee::operator()
                          (&local_50,u,*(HighsInt *)(ppVar3 + -8));
        ppVar3 = ppVar1;
        ppVar5 = ppVar1;
      } while (bVar2);
      *(HighsInt *)ppVar5 = u;
      uVar6 = local_40 + (-(long)(ppVar5 + lVar4) >> 2);
    } while (uVar6 < 9);
  }
  return bVar7;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }